

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3MPrintf(sqlite3 *db,char *zFormat,...)

{
  long lVar1;
  char *pcVar2;
  sqlite3 *in_RDX;
  long in_FS_OFFSET;
  char *z;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = sqlite3VMPrintf(in_RDX,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pcVar2;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE char *sqlite3MPrintf(sqlite3 *db, const char *zFormat, ...){
  va_list ap;
  char *z;
  va_start(ap, zFormat);
  z = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  return z;
}